

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int roslz4_compress(roslz4_stream *str,int action)

{
  long lVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int wrote;
  int read;
  stream_state *state;
  int ret;
  bool local_29;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  if ((in_ESI == 0) || (in_ESI == 1)) {
    if (*(int *)(lVar1 + 0x20) == 0) {
      if (*(int *)(lVar1 + 0x30) == 0) {
        iVar2 = writeHeader((roslz4_stream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        if (iVar2 < 0) {
          return iVar2;
        }
        *(undefined4 *)(lVar1 + 0x30) = 1;
      }
      uVar3 = 0;
      iVar2 = 0;
      do {
        uVar3 = inputToBuffer((roslz4_stream *)CONCAT44(uVar3,iVar2));
        if ((int)uVar3 < 0) {
          return uVar3;
        }
        iVar2 = 0;
        if (((in_ESI == 1) || (*(int *)(lVar1 + 0x1c) == *(int *)(lVar1 + 0x18))) &&
           (iVar2 = bufferToOutput((roslz4_stream *)((ulong)uVar3 << 0x20)), iVar2 < 0)) {
          return iVar2;
        }
        local_29 = 0 < (int)uVar3 || 0 < iVar2;
      } while (local_29);
      if (in_ESI == 1) {
        local_4 = writeEOS((roslz4_stream *)CONCAT44(uVar3,iVar2));
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -4;
  }
  return local_4;
}

Assistant:

int roslz4_compress(roslz4_stream *str, int action) {
  int ret;
  stream_state *state = str->state;
  if (action != ROSLZ4_RUN && action != ROSLZ4_FINISH) {
    return ROSLZ4_PARAM_ERROR; // Unrecognized compression action
  } else if (state->finished) {
    return ROSLZ4_ERROR; // Cannot call action on finished stream
  }

  if (!state->wrote_header) {
    ret = writeHeader(str);
    if (ret < 0) { return ret; }
    state->wrote_header = 1;
  }

  // Copy input to internal buffer, compressing when full or finishing stream
  int read = 0, wrote = 0;
  do {
    read = inputToBuffer(str);
    if (read < 0) { return read; }

    wrote = 0;
    if (action == ROSLZ4_FINISH || state->buffer_offset == state->buffer_size) {
      wrote = bufferToOutput(str);
      if (wrote < 0) { return wrote; }
    }
  } while (read > 0 || wrote > 0);

  // Signal end of stream if finishing up, otherwise done
  if (action == ROSLZ4_FINISH) {
    return writeEOS(str);
  } else {
    return ROSLZ4_OK;
  }
}